

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

uint32_t Image_Function::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  uchar *puVar9;
  uchar *puVar10;
  ushort uVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  uint uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar12 [16];
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar1 = image->_rowSize;
  if (uVar1 == width) {
    uVar7 = height;
    uVar6 = 1;
    if (width < (uint)(0xffffffff / (ulong)height)) {
      uVar7 = 1;
      uVar6 = height;
    }
    height = uVar7;
    width = width * uVar6;
  }
  if (height * uVar1 == 0) {
    uVar20 = 0;
  }
  else {
    puVar9 = image->_data + (ulong)x + (ulong)(y * uVar1);
    puVar10 = puVar9 + height * uVar1;
    auVar15 = vpbroadcastq_avx512f();
    uVar20 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (width != 0) {
        auVar21 = ZEXT464(uVar20);
        uVar8 = 0;
        do {
          auVar18 = vmovdqa64_avx512f(auVar21);
          auVar21 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar21,auVar16);
          auVar21 = vporq_avx512f(auVar21,auVar17);
          uVar3 = vpcmpuq_avx512f(auVar21,auVar15,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar19,auVar15,2);
          bVar5 = (byte)uVar3;
          uVar11 = CONCAT11(bVar5,bVar4);
          auVar12 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar9 + uVar8));
          auVar13[1] = ((byte)(uVar11 >> 1) & 1) * auVar12[1];
          auVar13[0] = (bVar4 & 1) * auVar12[0];
          auVar13[2] = ((byte)(uVar11 >> 2) & 1) * auVar12[2];
          auVar13[3] = ((byte)(uVar11 >> 3) & 1) * auVar12[3];
          auVar13[4] = ((byte)(uVar11 >> 4) & 1) * auVar12[4];
          auVar13[5] = ((byte)(uVar11 >> 5) & 1) * auVar12[5];
          auVar13[6] = ((byte)(uVar11 >> 6) & 1) * auVar12[6];
          auVar13[7] = ((byte)(uVar11 >> 7) & 1) * auVar12[7];
          auVar13[8] = (bVar5 & 1) * auVar12[8];
          auVar13[9] = (bVar5 >> 1 & 1) * auVar12[9];
          auVar13[10] = (bVar5 >> 2 & 1) * auVar12[10];
          auVar13[0xb] = (bVar5 >> 3 & 1) * auVar12[0xb];
          auVar13[0xc] = (bVar5 >> 4 & 1) * auVar12[0xc];
          auVar13[0xd] = (bVar5 >> 5 & 1) * auVar12[0xd];
          auVar13[0xe] = (bVar5 >> 6 & 1) * auVar12[0xe];
          auVar13[0xf] = -((char)bVar5 >> 7) * auVar12[0xf];
          auVar21 = vpmovzxbd_avx512f(auVar13);
          auVar21 = vpaddd_avx512f(auVar18,auVar21);
          uVar8 = uVar8 + 0x10;
        } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
        auVar21 = vmovdqa32_avx512f(auVar21);
        auVar19._0_4_ = (uint)(bVar4 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar18._0_4_
        ;
        bVar2 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar19._4_4_ = (uint)bVar2 * auVar21._4_4_ | (uint)!bVar2 * auVar18._4_4_;
        bVar2 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar19._8_4_ = (uint)bVar2 * auVar21._8_4_ | (uint)!bVar2 * auVar18._8_4_;
        bVar2 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar19._12_4_ = (uint)bVar2 * auVar21._12_4_ | (uint)!bVar2 * auVar18._12_4_;
        bVar2 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar19._16_4_ = (uint)bVar2 * auVar21._16_4_ | (uint)!bVar2 * auVar18._16_4_;
        bVar2 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar19._20_4_ = (uint)bVar2 * auVar21._20_4_ | (uint)!bVar2 * auVar18._20_4_;
        bVar2 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar19._24_4_ = (uint)bVar2 * auVar21._24_4_ | (uint)!bVar2 * auVar18._24_4_;
        bVar2 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar19._28_4_ = (uint)bVar2 * auVar21._28_4_ | (uint)!bVar2 * auVar18._28_4_;
        auVar19._32_4_ =
             (uint)(bVar5 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._32_4_;
        bVar2 = (bool)(bVar5 >> 1 & 1);
        auVar19._36_4_ = (uint)bVar2 * auVar21._36_4_ | (uint)!bVar2 * auVar18._36_4_;
        bVar2 = (bool)(bVar5 >> 2 & 1);
        auVar19._40_4_ = (uint)bVar2 * auVar21._40_4_ | (uint)!bVar2 * auVar18._40_4_;
        bVar2 = (bool)(bVar5 >> 3 & 1);
        auVar19._44_4_ = (uint)bVar2 * auVar21._44_4_ | (uint)!bVar2 * auVar18._44_4_;
        bVar2 = (bool)(bVar5 >> 4 & 1);
        auVar19._48_4_ = (uint)bVar2 * auVar21._48_4_ | (uint)!bVar2 * auVar18._48_4_;
        bVar2 = (bool)(bVar5 >> 5 & 1);
        auVar19._52_4_ = (uint)bVar2 * auVar21._52_4_ | (uint)!bVar2 * auVar18._52_4_;
        bVar2 = (bool)(bVar5 >> 6 & 1);
        auVar19._56_4_ = (uint)bVar2 * auVar21._56_4_ | (uint)!bVar2 * auVar18._56_4_;
        auVar19._60_4_ =
             (uint)(bVar5 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar18._60_4_;
        auVar14 = vextracti64x4_avx512f(auVar19,1);
        auVar21 = vpaddd_avx512f(auVar19,ZEXT3264(auVar14));
        auVar12 = vpaddd_avx(auVar21._0_16_,auVar21._16_16_);
        auVar13 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddd_avx(auVar12,auVar13);
        auVar13 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpaddd_avx(auVar12,auVar13);
        uVar20 = auVar12._0_4_;
      }
      puVar9 = puVar9 + uVar1;
    } while (puVar9 != puVar10);
  }
  return uVar20;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        uint32_t sum = 0;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                sum += (*imageX);
        }

        return sum;
    }